

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *value)

{
  int iVar1;
  Arena *my_arena;
  bool bVar2;
  int __old_val;
  int iVar3;
  Arena *value_arena;
  Rep *pRVar4;
  void *pvVar5;
  size_t sVar6;
  uint uVar7;
  undefined1 *puVar8;
  RepeatedPtrFieldBase *pRVar9;
  undefined1 auStack_38 [16];
  
  puVar8 = auStack_38;
  if (value == (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
               0x0) {
    AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)auStack_38);
    sVar6 = strlen((char *)value);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (puVar8,sVar6,value);
    return;
  }
  value_arena = GenericTypeHandler<google::protobuf::Message>::GetArena(value);
  my_arena = this->arena_;
  if (my_arena == value_arena) {
    bVar2 = AllocatedSizeAtCapacity(this);
    if (!bVar2) {
      pvVar5 = this->tagged_rep_or_elem_;
      pRVar9 = this;
      if (((ulong)pvVar5 & 1) != 0) {
        pRVar4 = rep(this);
        pRVar9 = (RepeatedPtrFieldBase *)pRVar4->elements;
        pvVar5 = this->tagged_rep_or_elem_;
      }
      iVar1 = this->current_size_;
      if (((ulong)pvVar5 & 1) == 0) {
        uVar7 = (uint)(pvVar5 != (void *)0x0);
        iVar3 = iVar1;
      }
      else {
        pRVar4 = rep(this);
        uVar7 = pRVar4->allocated_size;
        iVar3 = this->current_size_;
      }
      if (iVar1 < (int)uVar7) {
        pvVar5 = (&pRVar9->tagged_rep_or_elem_)[iVar3];
        if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
          uVar7 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
        }
        else {
          pRVar4 = rep(this);
          uVar7 = pRVar4->allocated_size;
          iVar3 = this->current_size_;
        }
        (&pRVar9->tagged_rep_or_elem_)[(int)uVar7] = pvVar5;
      }
      this->current_size_ = iVar3 + 1;
      (&pRVar9->tagged_rep_or_elem_)[iVar3] = value;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar4 = rep(this);
        pRVar4->allocated_size = pRVar4->allocated_size + 1;
      }
      return;
    }
  }
  AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (this,value,value_arena,my_arena);
  return;
}

Assistant:

void AddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    Arena* element_arena = TypeHandler::GetArena(value);
    Arena* arena = GetArena();
    if (arena != element_arena || AllocatedSizeAtCapacity()) {
      AddAllocatedSlowWithCopy<TypeHandler>(value, element_arena, arena);
      return;
    }
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at
    // least one slot that is not allocated).
    void** elems = elements();
    if (current_size_ < allocated_size()) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[allocated_size()] = elems[current_size_];
    }
    elems[ExchangeCurrentSize(current_size_ + 1)] = value;
    if (!using_sso()) ++rep()->allocated_size;
  }